

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O0

IPAsKeyLRU * __thiscall LruHash<IPAsKeyLRU>::Remove(LruHash<IPAsKeyLRU> *this,IPAsKeyLRU *key)

{
  IPAsKeyLRU *key_00;
  IPAsKeyLRU *retKey;
  IPAsKeyLRU *key_local;
  LruHash<IPAsKeyLRU> *this_local;
  
  key_00 = BinHash<IPAsKeyLRU>::Remove(&this->binHash,key);
  if (key_00 != (IPAsKeyLRU *)0x0) {
    LruUnlink(this,key_00);
  }
  return key_00;
}

Assistant:

KeyObj * Remove(KeyObj * key)
    {
        KeyObj * retKey = binHash.Remove(key);

        if (retKey != NULL)
        {
            LruUnlink(retKey);
        }

        return retKey;
    }